

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetScalarFieldOfTable
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  BaseType BVar1;
  BaseType BVar2;
  string default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string getter;
  
  GenGetter_abi_cxx11_(&getter,this,&(field->value).type);
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&default_value,&this->namer_,field);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::append((char *)code_ptr);
  OffsetPrefix_abi_cxx11_(&default_value,this,field,true);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::append((char *)&getter);
  BVar1 = (field->value).type.base_type;
  if (BVar1 == BASE_TYPE_BOOL) {
    std::operator+(&local_d0,"bool(",&getter);
    std::operator+(&default_value,&local_d0,")");
    std::__cxx11::string::operator=((string *)&getter,(string *)&default_value);
    std::__cxx11::string::~string((string *)&default_value);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_90,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_70,&local_90,"return ");
  std::operator+(&local_d0,&local_70,&getter);
  std::operator+(&default_value,&local_d0,"\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  default_value._M_dataplus._M_p = (pointer)&default_value.field_2;
  default_value._M_string_length = 0;
  default_value.field_2._M_local_buf[0] = '\0';
  BVar2 = (field->value).type.base_type;
  if ((0xb < BVar2 - BASE_TYPE_UTYPE) || (field->presence != kOptional)) {
    if (BVar1 != BASE_TYPE_BOOL) {
      if (BVar2 - BASE_TYPE_FLOAT < 2) {
        FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                  (&local_d0,&(this->float_const_gen_).super_FloatConstantGenerator,field);
      }
      else {
        std::__cxx11::string::string((string *)&local_d0,(string *)&(field->value).constant);
      }
      std::__cxx11::string::_M_assign((string *)&default_value);
      std::__cxx11::string::~string((string *)&local_d0);
      goto LAB_001e054b;
    }
    std::operator==(&(field->value).constant,"0");
  }
  std::__cxx11::string::assign((char *)&default_value);
LAB_001e054b:
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(anonymous_namespace)::Indent_abi_cxx11_);
  std::operator+(&local_90,&local_b0,"return ");
  std::operator+(&local_70,&local_90,&default_value);
  std::operator+(&local_d0,&local_70,"\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&default_value);
  std::__cxx11::string::~string((string *)&getter);
  return;
}

Assistant:

void GetScalarFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) const {
    auto &code = *code_ptr;
    std::string getter = GenGetter(field.value.type);
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);
    code += "(self):";
    code += OffsetPrefix(field);
    getter += "o + self._tab.Pos)";
    auto is_bool = IsBool(field.value.type.base_type);
    if (is_bool) { getter = "bool(" + getter + ")"; }
    code += Indent + Indent + Indent + "return " + getter + "\n";
    std::string default_value;
    if (field.IsScalarOptional()) {
      default_value = "None";
    } else if (is_bool) {
      default_value = field.value.constant == "0" ? "False" : "True";
    } else {
      default_value = IsFloat(field.value.type.base_type)
                          ? float_const_gen_.GenFloatConstant(field)
                          : field.value.constant;
    }
    code += Indent + Indent + "return " + default_value + "\n\n";
  }